

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void dma_synchronize(Emulator *e)

{
  Ticks TVar1;
  Ticks TVar2;
  Ticks TVar3;
  byte bVar4;
  u8 value_00;
  MemoryTypeAddressPair pair;
  u8 value;
  u8 addr_offset;
  Ticks cpu_tick;
  Ticks delta_ticks;
  Emulator *e_local;
  
  if (((e->state).dma.state != DMA_INACTIVE) && ((e->state).dma.sync_ticks < (e->state).ticks)) {
    TVar1 = (e->state).ticks;
    TVar2 = (e->state).dma.sync_ticks;
    (e->state).dma.sync_ticks = (e->state).ticks;
    TVar3 = (e->state).cpu_tick;
    for (cpu_tick = TVar1 - TVar2; cpu_tick != 0; cpu_tick = cpu_tick - TVar3) {
      if ((e->state).dma.tick_count < 8) {
        (e->state).dma.tick_count = (e->state).dma.tick_count + 4;
        if (7 < (e->state).dma.tick_count) {
          (e->state).dma.tick_count = 8;
          (e->state).dma.state = DMA_ACTIVE;
        }
      }
      else {
        bVar4 = (byte)((e->state).dma.tick_count - 8 >> 2);
        if (0x9f < bVar4) {
          __assert_fail("addr_offset < OAM_TRANSFER_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                        ,0xf80,"void dma_synchronize(Emulator *)");
        }
        pair = map_address((e->state).dma.source + (ushort)bVar4);
        value_00 = read_u8_pair(e,pair,FALSE);
        write_oam_no_mode_check(e,(ushort)bVar4,value_00);
        (e->state).dma.tick_count = (e->state).dma.tick_count + 4;
        if (0x287 < (e->state).dma.tick_count) {
          (e->state).dma.tick_count = (e->state).dma.tick_count - 0x288;
          (e->state).dma.state = DMA_INACTIVE;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void dma_synchronize(Emulator* e) {
  if (UNLIKELY(DMA.state != DMA_INACTIVE)) {
    if (TICKS > DMA.sync_ticks) {
      Ticks delta_ticks = TICKS - DMA.sync_ticks;
      DMA.sync_ticks = TICKS;

      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        if (DMA.tick_count < DMA_DELAY_TICKS) {
          DMA.tick_count += CPU_TICK;
          if (DMA.tick_count >= DMA_DELAY_TICKS) {
            DMA.tick_count = DMA_DELAY_TICKS;
            DMA.state = DMA_ACTIVE;
          }
          continue;
        }

        u8 addr_offset = (DMA.tick_count - DMA_DELAY_TICKS) >> 2;
        assert(addr_offset < OAM_TRANSFER_SIZE);
        u8 value =
            read_u8_pair(e, map_address(DMA.source + addr_offset), FALSE);
        write_oam_no_mode_check(e, addr_offset, value);
        DMA.tick_count += CPU_TICK;
        if (VALUE_WRAPPED(DMA.tick_count, DMA_TICKS)) {
          DMA.state = DMA_INACTIVE;
          break;
        }
      }
    }
  }
}